

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O0

int64_t absl::lts_20250127::ToUnixMicros(Time t)

{
  uint32_t uVar1;
  int64_t iVar2;
  uint32_t in_EDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar3;
  HiRep this;
  Time t_00;
  Time t_01;
  Time t_02;
  Duration d;
  Time t_03;
  Duration d_00;
  Time t_04;
  Duration DVar4;
  Duration DVar5;
  HiRep local_148;
  HiRep local_100;
  HiRep local_b0;
  HiRep local_68;
  Time t_local;
  undefined8 extraout_RDX_01;
  
  t_00.rep_.rep_hi_.lo_ = t.rep_.rep_lo_;
  this = t.rep_.rep_hi_;
  t_00.rep_.rep_hi_.hi_ = 0;
  t_00.rep_.rep_lo_ = in_EDX;
  DVar4 = time_internal::ToUnixDuration((time_internal *)this,t_00);
  local_68 = DVar4.rep_hi_;
  DVar4.rep_hi_.hi_ = 0;
  DVar4.rep_hi_.lo_ = DVar4.rep_lo_;
  iVar2 = time_internal::GetRepHi((time_internal *)local_68,DVar4);
  uVar3 = extraout_RDX;
  if (-1 < iVar2) {
    t_01.rep_.rep_hi_.hi_ = 0;
    t_01.rep_.rep_hi_.lo_ = t_00.rep_.rep_hi_.lo_;
    t_01.rep_.rep_lo_ = (uint32_t)extraout_RDX;
    DVar4 = time_internal::ToUnixDuration((time_internal *)this,t_01);
    DVar5.rep_lo_ = DVar4.rep_lo_;
    local_b0 = DVar4.rep_hi_;
    DVar5.rep_hi_.hi_ = 0;
    DVar5.rep_hi_.lo_ = DVar5.rep_lo_;
    iVar2 = time_internal::GetRepHi((time_internal *)local_b0,DVar5);
    uVar3 = extraout_RDX_00;
    if (iVar2 >> 0x2b == 0) {
      t_02.rep_.rep_hi_.hi_ = 0;
      t_02.rep_.rep_hi_.lo_ = t_00.rep_.rep_hi_.lo_;
      t_02.rep_.rep_lo_ = (uint32_t)extraout_RDX_00;
      DVar4 = time_internal::ToUnixDuration((time_internal *)this,t_02);
      d.rep_lo_ = DVar4.rep_lo_;
      local_100 = DVar4.rep_hi_;
      d.rep_hi_.hi_ = 0;
      d.rep_hi_.lo_ = d.rep_lo_;
      iVar2 = time_internal::GetRepHi((time_internal *)local_100,d);
      t_03.rep_.rep_hi_.hi_ = 0;
      t_03.rep_.rep_hi_.lo_ = t_00.rep_.rep_hi_.lo_;
      t_03.rep_.rep_lo_ = (uint32_t)extraout_RDX_01;
      DVar4 = time_internal::ToUnixDuration((time_internal *)this,t_03);
      d_00.rep_lo_ = DVar4.rep_lo_;
      local_148 = DVar4.rep_hi_;
      d_00.rep_hi_.hi_ = 0;
      d_00.rep_hi_.lo_ = d_00.rep_lo_;
      uVar1 = time_internal::GetRepLo((time_internal *)local_148,d_00);
      return iVar2 * 1000000 + (ulong)uVar1 / 4000;
    }
  }
  t_04.rep_.rep_hi_.hi_ = 0;
  t_04.rep_.rep_hi_.lo_ = t_00.rep_.rep_hi_.lo_;
  t_04.rep_.rep_lo_ = (uint32_t)uVar3;
  DVar4 = time_internal::ToUnixDuration((time_internal *)this,t_04);
  DVar5 = Microseconds<int,_0>(1);
  iVar2 = anon_unknown_8::FloorToUnit(DVar4,DVar5);
  return iVar2;
}

Assistant:

int64_t ToUnixMicros(Time t) {
  if (time_internal::GetRepHi(time_internal::ToUnixDuration(t)) >= 0 &&
      time_internal::GetRepHi(time_internal::ToUnixDuration(t)) >> 43 == 0) {
    return (time_internal::GetRepHi(time_internal::ToUnixDuration(t)) *
            1000 * 1000) +
           (time_internal::GetRepLo(time_internal::ToUnixDuration(t)) / 4000);
  }
  return FloorToUnit(time_internal::ToUnixDuration(t), absl::Microseconds(1));
}